

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::GetRange
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs,
          InternalKey *smallest,InternalKey *largest)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  InternalKey *pIVar4;
  const_reference ppFVar5;
  InternalKeyComparator *in_RCX;
  InternalKey *in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i;
  InternalKey *in_stack_ffffffffffffffb8;
  value_type in_stack_ffffffffffffffc8;
  InternalKey *this_00;
  InternalKey *a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffffc8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!inputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x4a0,
                  "void leveldb::VersionSet::GetRange(const std::vector<FileMetaData *> &, InternalKey *, InternalKey *)"
                 );
  }
  InternalKey::Clear(in_stack_ffffffffffffffb8);
  InternalKey::Clear(in_stack_ffffffffffffffb8);
  this_00 = (InternalKey *)0x0;
  while (a = this_00,
        pIVar4 = (InternalKey *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      this_00), this_00 < pIVar4) {
    ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)in_stack_ffffffffffffffc8,(size_type)in_RDI);
    in_stack_ffffffffffffffc8 = *ppFVar5;
    if (a == (InternalKey *)0x0) {
      InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,in_RDI);
      InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,in_RDI);
    }
    else {
      iVar3 = InternalKeyComparator::Compare(in_RCX,a,(InternalKey *)in_stack_ffffffffffffffc8);
      if (iVar3 < 0) {
        InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,in_RDI);
      }
      iVar3 = InternalKeyComparator::Compare(in_RCX,a,(InternalKey *)in_stack_ffffffffffffffc8);
      if (0 < iVar3) {
        InternalKey::operator=((InternalKey *)in_stack_ffffffffffffffc8,in_RDI);
      }
    }
    this_00 = (InternalKey *)((long)&(a->rep_)._M_dataplus._M_p + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VersionSet::GetRange(const std::vector<FileMetaData*>& inputs,
                          InternalKey* smallest, InternalKey* largest) {
  assert(!inputs.empty());
  smallest->Clear();
  largest->Clear();
  for (size_t i = 0; i < inputs.size(); i++) {
    FileMetaData* f = inputs[i];
    if (i == 0) {
      *smallest = f->smallest;
      *largest = f->largest;
    } else {
      if (icmp_.Compare(f->smallest, *smallest) < 0) {
        *smallest = f->smallest;
      }
      if (icmp_.Compare(f->largest, *largest) > 0) {
        *largest = f->largest;
      }
    }
  }
}